

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_state_acct_resp(Curl_easy *data,int ftpcode)

{
  CURLcode local_18;
  CURLcode result;
  int ftpcode_local;
  Curl_easy *data_local;
  
  if (ftpcode == 0xe6) {
    local_18 = ftp_state_loggedin(data);
  }
  else {
    Curl_failf(data,"ACCT rejected by server: %03d",(ulong)(uint)ftpcode);
    local_18 = CURLE_FTP_WEIRD_PASS_REPLY;
  }
  return local_18;
}

Assistant:

static CURLcode ftp_state_acct_resp(struct Curl_easy *data,
                                    int ftpcode)
{
  CURLcode result = CURLE_OK;
  if(ftpcode != 230) {
    failf(data, "ACCT rejected by server: %03d", ftpcode);
    result = CURLE_FTP_WEIRD_PASS_REPLY; /* FIX */
  }
  else
    result = ftp_state_loggedin(data);

  return result;
}